

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  ushort *p;
  size_t sVar4;
  bool bVar5;
  MessageLite *this_00;
  ushort *p_00;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  uint uVar9;
  uint32_t res;
  ushort *unaff_RBP;
  uint uVar10;
  ExtensionInfo *extension_00;
  byte bVar11;
  int field_number;
  ulong uVar12;
  ulong unaff_R14;
  ulong uVar13;
  pair<const_char_*,_int> pVar14;
  pair<const_char_*,_unsigned_int> pVar15;
  string_view flat;
  string_view val;
  bool was_packed_on_wire;
  string payload;
  ExtensionInfo extension;
  ParseContext tmp_ctx;
  ushort *local_128;
  bool local_119;
  ExtensionSet *local_118;
  InternalMetadata *local_110;
  MessageLite *local_108;
  char *local_100;
  size_t local_f8;
  char local_f0;
  undefined7 uStack_ef;
  Data *local_e0;
  ExtensionInfo local_d8;
  undefined1 local_a0 [32];
  ZeroCopyInputStream *local_80;
  char acStack_78 [40];
  uint32_t local_50;
  int local_4c;
  int local_48;
  int local_44;
  DescriptorPool *local_40;
  MessageFactory *pMStack_38;
  
  local_100 = &local_f0;
  local_f8 = 0;
  local_f0 = '\0';
  local_e0 = &ctx->data_;
  bVar11 = 0;
  uVar13 = 0;
  local_128 = (ushort *)ptr;
  local_118 = this;
  local_110 = metadata;
  local_108 = extendee;
  do {
    bVar5 = EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)&local_128,ctx->group_depth_);
    p = local_128;
    p_00 = local_128;
    if (bVar5) break;
    p_00 = (ushort *)((long)local_128 + 1);
    if ((byte)*local_128 == 0x1a) {
      if (bVar11 == 1) {
        local_128 = p_00;
        local_128 = (ushort *)
                    ParseField(local_118,uVar13 * 8 + 2,(char *)p_00,local_108,local_110,ctx);
        bVar11 = 3;
        p_00 = unaff_RBP;
        if (local_128 == (ushort *)0x0) {
          bVar11 = 1;
LAB_0040f7d4:
          bVar5 = false;
          p_00 = (ushort *)0x0;
        }
        else {
LAB_0040f8dd:
          bVar5 = true;
        }
      }
      else {
        local_a0._0_8_ = local_a0 + 0x10;
        local_a0._8_8_ = (char *)0x0;
        local_a0[0x10] = '\0';
        bVar1 = *(byte *)p_00;
        if ((char)bVar1 < '\0') {
          local_128 = p_00;
          pVar14 = ReadSizeFallback((char *)p_00,(uint)bVar1);
          auVar2 = pVar14._0_12_;
        }
        else {
          auVar2[8] = bVar1;
          auVar2._0_8_ = local_128 + 1;
          auVar2._9_3_ = 0;
        }
        local_128 = auVar2._0_8_;
        if ((local_128 == (ushort *)0x0) ||
           (local_128 = (ushort *)
                        EpsCopyInputStream::ReadString
                                  (&ctx->super_EpsCopyInputStream,(char *)local_128,auVar2._8_4_,
                                   (string *)local_a0), local_128 == (ushort *)0x0)) {
          bVar5 = false;
          p_00 = (ushort *)0x0;
        }
        else {
          bVar5 = true;
          p_00 = unaff_RBP;
          if (bVar11 == 0) {
            std::__cxx11::string::operator=((string *)&local_100,(string *)local_a0);
            bVar11 = 2;
          }
        }
        if ((MessageLite *)local_a0._0_8_ != (MessageLite *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
        }
        if (bVar5) goto LAB_0040f8dd;
        bVar5 = false;
      }
    }
    else {
      if ((byte)*local_128 != 0x10) {
        bVar1 = (byte)*local_128;
        uVar9 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          res = ((uint)bVar1 + (uint)*(byte *)p_00 * 0x80) - 0x80;
          if ((char)*(byte *)p_00 < '\0') {
            local_128 = p_00;
            pVar15 = ReadTagFallback((char *)p,res);
            auVar3 = pVar15._0_12_;
          }
          else {
            auVar3._8_4_ = res;
            auVar3._0_8_ = local_128 + 1;
          }
          uVar9 = auVar3._8_4_;
          p_00 = auVar3._0_8_;
        }
        local_128 = p_00;
        if (uVar9 != 0 && (uVar9 & 7) != 4) {
          local_128 = (ushort *)
                      ParseField(local_118,(ulong)uVar9,(char *)p_00,local_108,local_110,ctx);
          p_00 = unaff_RBP;
          if (local_128 == (ushort *)0x0) goto LAB_0040f7d4;
          goto LAB_0040f8dd;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
        bVar5 = false;
        goto LAB_0040f8e6;
      }
      uVar10 = (uint)(char)*p_00;
      uVar9 = (*p_00 & uVar10) + uVar10;
      uVar12 = (ulong)(uVar9 >> 1);
      if ((short)uVar9 < 0) {
        local_128 = (ushort *)((long)local_128 + 3);
        lVar8 = 0xd;
        do {
          uVar10 = (uint)(char)*local_128;
          uVar9 = (*local_128 & uVar10) + uVar10;
          uVar12 = ((ulong)uVar9 - 2 << ((byte)lVar8 & 0x3f)) + uVar12;
          if (-1 < (short)uVar9) {
            local_128 = (ushort *)((long)local_128 + (ulong)(uVar9 < uVar10) + 1);
            goto LAB_0040f58e;
          }
          lVar8 = lVar8 + 0xe;
          local_128 = local_128 + 1;
        } while (lVar8 != 0x45);
        local_128 = (ushort *)0x0;
        uVar12 = unaff_R14;
      }
      else {
        local_128 = (ushort *)((long)local_128 + (ulong)(uVar9 < uVar10) + 2);
      }
LAB_0040f58e:
      bVar5 = false;
      if ((local_128 == (ushort *)0x0) || (field_number = (int)uVar12, field_number == 0)) {
        unaff_RBP = (ushort *)0x0;
      }
      else {
        bVar5 = true;
        if (bVar11 == 0) {
          bVar11 = 1;
        }
        else {
          if (bVar11 != 2) goto LAB_0040f8d6;
          local_d8.descriptor = (FieldDescriptor *)0x0;
          local_d8.lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
          local_d8.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
          local_d8.field_6.enum_validity_check.arg = (void *)0x0;
          local_d8.message = (MessageLite *)0x0;
          local_d8.number = 0;
          local_d8.type = '\0';
          local_d8.is_repeated = false;
          local_d8.is_packed = false;
          local_d8.is_lazy = kUndefined;
          local_a0._0_8_ = local_108;
          extension_00 = &local_d8;
          bVar5 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                            (local_118,2,field_number,(GeneratedExtensionFinder *)local_a0,
                             extension_00,&local_119);
          sVar4 = local_f8;
          pcVar6 = local_100;
          if (bVar5) {
            if (local_d8.is_repeated == true) {
              this_00 = AddMessage(local_118,field_number,'\v',
                                   local_d8.field_6.message_info.prototype,local_d8.descriptor);
            }
            else {
              this_00 = MutableMessage(local_118,field_number,'\v',
                                       local_d8.field_6.message_info.prototype,local_d8.descriptor);
            }
            acStack_78[0x18] = '\0';
            acStack_78[0x19] = '\0';
            acStack_78[0x1a] = '\0';
            acStack_78[0x1b] = '\0';
            acStack_78[0x1c] = '\0';
            acStack_78[0x1d] = '\0';
            acStack_78[0x1e] = '\0';
            acStack_78[0x1f] = '\0';
            acStack_78[0x20] = '\0';
            acStack_78[0x21] = '\0';
            acStack_78[0x22] = '\0';
            acStack_78[0x23] = '\0';
            acStack_78[0x24] = '\0';
            acStack_78[0x25] = '\0';
            acStack_78[0x26] = '\0';
            acStack_78[0x27] = '\0';
            acStack_78[8] = '\0';
            acStack_78[9] = '\0';
            acStack_78[10] = '\0';
            acStack_78[0xb] = '\0';
            acStack_78[0xc] = '\0';
            acStack_78[0xd] = '\0';
            acStack_78[0xe] = '\0';
            acStack_78[0xf] = '\0';
            acStack_78[0x10] = '\0';
            acStack_78[0x11] = '\0';
            acStack_78[0x12] = '\0';
            acStack_78[0x13] = '\0';
            acStack_78[0x14] = '\0';
            acStack_78[0x15] = '\0';
            acStack_78[0x16] = '\0';
            acStack_78[0x17] = '\0';
            local_80 = (ZeroCopyInputStream *)0x0;
            acStack_78[0] = '\0';
            acStack_78[1] = '\0';
            acStack_78[2] = '\0';
            acStack_78[3] = '\0';
            acStack_78[4] = '\0';
            acStack_78[5] = '\0';
            acStack_78[6] = '\0';
            acStack_78[7] = '\0';
            local_50 = 0;
            local_4c = 0x7fffffff;
            local_48 = ctx->depth_;
            local_44 = -0x80000000;
            local_40 = local_e0->pool;
            pMStack_38 = local_e0->factory;
            flat._M_str = local_100;
            flat._M_len = local_f8;
            pcVar6 = EpsCopyInputStream::InitFrom((EpsCopyInputStream *)local_a0,flat);
            pcVar6 = MessageLite::_InternalParse(this_00,pcVar6,(ParseContext *)local_a0);
            bVar5 = local_50 == 0 && pcVar6 != (char *)0x0;
            if (local_50 != 0 || pcVar6 == (char *)0x0) {
              unaff_RBP = (ushort *)0x0;
            }
            bVar11 = bVar5 | 2;
          }
          else {
            if ((local_110->ptr_ & 1U) == 0) {
              pbVar7 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                                 (local_110);
            }
            else {
              pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((local_110->ptr_ & 0xfffffffffffffffeU) + 8);
            }
            val._M_str = (char *)pbVar7;
            val._M_len = (size_t)pcVar6;
            WriteLengthDelimited
                      ((internal *)(uVar12 & 0xffffffff),(uint32_t)sVar4,val,(string *)extension_00)
            ;
            bVar11 = 3;
            bVar5 = true;
          }
        }
        uVar13 = uVar12 & 0xffffffff;
      }
LAB_0040f8d6:
      p_00 = unaff_RBP;
      unaff_R14 = uVar12;
      if (bVar5) goto LAB_0040f8dd;
      bVar5 = false;
    }
LAB_0040f8e6:
    unaff_RBP = p_00;
  } while (bVar5);
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return (char *)p_00;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  enum class State { kNoTag, kHasType, kHasPayload, kDone };
  State state = State::kNoTag;

  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      // We should fail parsing if type id is 0 after cast to uint32.
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                     static_cast<uint32_t>(tmp) != 0);
      if (state == State::kNoTag) {
        type_id = static_cast<uint32_t>(tmp);
        state = State::kHasType;
      } else if (state == State::kHasPayload) {
        type_id = static_cast<uint32_t>(tmp);
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools. Spawn a new
          // ParseContext inheriting those attributes.
          ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        state = State::kDone;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (state == State::kHasType) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        state = State::kDone;
      } else {
        std::string tmp;
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        if (state == State::kNoTag) {
          payload = std::move(tmp);
          state = State::kHasPayload;
        }
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}